

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  bool bVar1;
  Type TVar2;
  int field_number;
  size_t sVar3;
  mapped_type *pmVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string hasBitsMask;
  string hasBitsNumber;
  int i_1;
  int i;
  string tag_bytes;
  uint8 tag_array [5];
  uint tag;
  int part_tag_size;
  int tag_size;
  undefined4 in_stack_ffffffffffffef08;
  uint in_stack_ffffffffffffef0c;
  AlphaNum *in_stack_ffffffffffffef10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef18;
  FieldDescriptor *in_stack_ffffffffffffef20;
  allocator *paVar6;
  char *in_stack_ffffffffffffef30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef38;
  FieldGeneratorBase *in_stack_ffffffffffffef48;
  key_type *__k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef50;
  char *in_stack_ffffffffffffef58;
  FieldGeneratorBase *in_stack_ffffffffffffef68;
  FieldGeneratorBase *in_stack_fffffffffffff028;
  allocator local_cb1;
  string local_cb0 [39];
  allocator local_c89;
  string local_c88 [39];
  allocator local_c61;
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [39];
  allocator local_bd9;
  string local_bd8 [39];
  allocator local_bb1;
  string local_bb0 [39];
  allocator local_b89;
  string local_b88 [32];
  string local_b68 [32];
  key_type local_b48;
  allocator local_b21;
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [39];
  allocator local_a11;
  string local_a10 [32];
  string local_9f0 [32];
  string local_9d0 [32];
  string local_9b0 [32];
  string local_990 [80];
  string local_940 [80];
  string local_8f0 [39];
  allocator local_8c9;
  string local_8c8 [39];
  allocator local_8a1;
  string local_8a0 [32];
  string local_880 [39];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [32];
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [39];
  allocator local_7c1;
  string local_7c0 [32];
  string local_7a0 [39];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [32];
  string local_730 [39];
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [32];
  string local_6c0 [39];
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [32];
  string local_628 [32];
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  string local_5c0 [39];
  allocator local_599;
  string local_598 [32];
  string local_578 [39];
  allocator local_551;
  string local_550 [32];
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [39];
  allocator local_499;
  string local_498 [32];
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [80];
  string local_320 [80];
  string local_2d0 [32];
  string local_2b0 [36];
  int local_28c;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [80];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [80];
  string local_140 [96];
  string local_e0 [32];
  string local_c0 [36];
  int local_9c;
  string local_68 [39];
  uint8 local_41 [5];
  uint32 local_3c;
  int local_38;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  uint8 *local_20;
  uint32 local_14;
  uint8 *local_10;
  uint32 local_4;
  
  local_30 = in_RSI;
  FieldDescriptor::number(*(FieldDescriptor **)(in_RDI + 0x18));
  FieldDescriptor::type(in_stack_ffffffffffffef20);
  sVar3 = internal::WireFormat::TagSize
                    ((int)((ulong)in_stack_ffffffffffffef10 >> 0x20),(Type)in_stack_ffffffffffffef10
                    );
  local_38 = (int)sVar3;
  local_34 = local_38;
  TVar2 = FieldDescriptor::type(in_stack_ffffffffffffef20);
  if (TVar2 == TYPE_GROUP) {
    local_38 = local_38 / 2;
  }
  local_3c = internal::WireFormat::MakeTag((FieldDescriptor *)in_stack_ffffffffffffef10);
  local_10 = local_41;
  local_4 = local_3c;
  io::CodedOutputStream::WriteVarint32ToArray(local_3c,local_10);
  strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
  StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
  for (local_9c = 1; local_9c < local_38; local_9c = local_9c + 1) {
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
    StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
    std::operator+((char *)in_stack_ffffffffffffef18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef10);
    std::__cxx11::string::operator+=(local_68,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
  }
  strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
  StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"tag",&local_191);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_140);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_140);
  strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
  StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"tag_size",&local_209);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_1b8);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"tag_bytes",&local_231);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_68);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  TVar2 = FieldDescriptor::type(in_stack_ffffffffffffef20);
  if (TVar2 == TYPE_GROUP) {
    field_number = FieldDescriptor::number(*(FieldDescriptor **)(in_RDI + 0x18));
    local_3c = internal::WireFormatLite::MakeTag(field_number,WIRETYPE_END_GROUP);
    local_20 = local_41;
    local_14 = local_3c;
    io::CodedOutputStream::WriteVarint32ToArray(local_3c,local_20);
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
    StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=(local_68,local_258);
    std::__cxx11::string::~string(local_258);
    for (local_28c = 1; local_28c < local_38; local_28c = local_28c + 1) {
      strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
      StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
      std::operator+((char *)in_stack_ffffffffffffef18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef10);
      std::__cxx11::string::operator+=(local_68,local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2d0);
    }
    strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
    StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_370,"end_tag",&local_371);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_320);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator((allocator<char> *)&local_371);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"end_tag_bytes",&local_399);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_68);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"access_level",&local_3c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,"public");
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  property_name_abi_cxx11_
            ((FieldGeneratorBase *)CONCAT44(in_stack_ffffffffffffef0c,in_stack_ffffffffffffef08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"property_name",&local_409);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_3e8);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e8);
  type_name_abi_cxx11_
            ((FieldGeneratorBase *)CONCAT44(in_stack_ffffffffffffef0c,in_stack_ffffffffffffef08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"type_name",&local_451);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_430);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::__cxx11::string::~string(local_430);
  FieldDescriptor::containing_type(*(FieldDescriptor **)(in_RDI + 0x18));
  GetClassName_abi_cxx11_((Descriptor *)in_stack_ffffffffffffef18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"extended_type",&local_499);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_478);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::__cxx11::string::~string(local_478);
  name_abi_cxx11_(in_stack_ffffffffffffef48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"name",&local_4e1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_4c0);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_4c0);
  psVar5 = FieldDescriptor::name_abi_cxx11_(*(FieldDescriptor **)(in_RDI + 0x18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"descriptor_name",&local_509);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar5);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  default_value_abi_cxx11_
            ((FieldGeneratorBase *)CONCAT44(in_stack_ffffffffffffef0c,in_stack_ffffffffffffef08));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"default_value",&local_551);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_530);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string(local_530);
  capitalized_type_name_abi_cxx11_(in_stack_fffffffffffff028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"capitalized_type_name",&local_599);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_578);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string(local_578);
  number_abi_cxx11_(in_stack_ffffffffffffef48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"number",&local_5e1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_5c0);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string(local_5c0);
  bVar1 = has_default_value(in_stack_ffffffffffffef68);
  if (bVar1) {
    FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 0x18));
    bVar1 = IsProto2((FileDescriptor *)0x525745);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,"name",&local_649);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::operator+(in_stack_ffffffffffffef38,in_stack_ffffffffffffef30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,"default_value",&local_671);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::operator+(in_stack_ffffffffffffef18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_698,"name_def_message",&local_699);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::__cxx11::string::operator=((string *)pmVar4,local_608);
      std::__cxx11::string::~string(local_698);
      std::allocator<char>::~allocator((allocator<char> *)&local_699);
      std::__cxx11::string::~string(local_608);
      std::__cxx11::string::~string(local_670);
      std::allocator<char>::~allocator((allocator<char> *)&local_671);
      std::__cxx11::string::~string(local_628);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      goto LAB_00525efe;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"name",&local_6e1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::operator+(in_stack_ffffffffffffef38,in_stack_ffffffffffffef30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"name_def_message",&local_709);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
  std::__cxx11::string::operator=((string *)pmVar4,local_6c0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
LAB_00525efe:
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 0x18));
  bVar1 = IsProto2((FileDescriptor *)0x525f26);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_750,"property_name",&local_751);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_778,"has_property_check",&local_779);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_730);
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::__cxx11::string::~string(local_730);
    std::__cxx11::string::~string(local_750);
    std::allocator<char>::~allocator((allocator<char> *)&local_751);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7c0,"property_name",&local_7c1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7e8,"other_has_property_check",&local_7e9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_7a0);
    std::__cxx11::string::~string(local_7e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
    std::__cxx11::string::~string(local_7a0);
    std::__cxx11::string::~string(local_7c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_830,"has_property_check",&local_831);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_858,"has_not_property_check",&local_859);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_810);
    std::__cxx11::string::~string(local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    std::__cxx11::string::~string(local_810);
    std::__cxx11::string::~string(local_830);
    std::allocator<char>::~allocator((allocator<char> *)&local_831);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8a0,"other_has_property_check",&local_8a1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8c8,"other_has_not_property_check",&local_8c9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::__cxx11::string::operator=((string *)pmVar4,local_880);
    std::__cxx11::string::~string(local_8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    std::__cxx11::string::~string(local_880);
    std::__cxx11::string::~string(local_8a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
    if (*(int *)(in_RDI + 0x20) != -1) {
      strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
      StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
      strings::AlphaNum::AlphaNum(in_stack_ffffffffffffef10,in_stack_ffffffffffffef0c);
      StrCat_abi_cxx11_((AlphaNum *)in_stack_ffffffffffffef48);
      std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      std::operator+(in_stack_ffffffffffffef18,(char *)in_stack_ffffffffffffef10);
      std::operator+(in_stack_ffffffffffffef18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef10);
      std::operator+(in_stack_ffffffffffffef18,(char *)in_stack_ffffffffffffef10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a10,"has_field_check",&local_a11);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::__cxx11::string::operator=((string *)pmVar4,local_990);
      std::__cxx11::string::~string(local_a10);
      std::allocator<char>::~allocator((allocator<char> *)&local_a11);
      std::__cxx11::string::~string(local_990);
      std::__cxx11::string::~string(local_9b0);
      std::__cxx11::string::~string(local_9d0);
      std::__cxx11::string::~string(local_9f0);
      std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      std::operator+(in_stack_ffffffffffffef18,(char *)in_stack_ffffffffffffef10);
      std::operator+(in_stack_ffffffffffffef18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a98,"set_has_field",&local_a99);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::__cxx11::string::operator=((string *)pmVar4,local_a38);
      std::__cxx11::string::~string(local_a98);
      std::allocator<char>::~allocator((allocator<char> *)&local_a99);
      std::__cxx11::string::~string(local_a38);
      std::__cxx11::string::~string(local_a58);
      std::__cxx11::string::~string(local_a78);
      std::operator+(in_stack_ffffffffffffef58,in_stack_ffffffffffffef50);
      std::operator+(in_stack_ffffffffffffef18,(char *)in_stack_ffffffffffffef10);
      std::operator+(in_stack_ffffffffffffef18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffef10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b20,"clear_has_field",&local_b21);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
      std::__cxx11::string::operator=((string *)pmVar4,local_ac0);
      std::__cxx11::string::~string(local_b20);
      std::allocator<char>::~allocator((allocator<char> *)&local_b21);
      std::__cxx11::string::~string(local_ac0);
      std::__cxx11::string::~string(local_ae0);
      std::__cxx11::string::~string(local_b00);
      std::__cxx11::string::~string(local_940);
      std::__cxx11::string::~string(local_8f0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b88,"property_name",&local_b89);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef38,in_stack_ffffffffffffef30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bb0,"default_value",&local_bb1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    std::operator+(in_stack_ffffffffffffef18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bd8,"has_property_check",&local_bd9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffef50,(key_type *)in_stack_ffffffffffffef48);
    __k = &local_b48;
    std::__cxx11::string::operator=((string *)pmVar4,(string *)__k);
    std::__cxx11::string::~string(local_bd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
    std::__cxx11::string::~string((string *)__k);
    std::__cxx11::string::~string(local_bb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
    std::__cxx11::string::~string(local_b68);
    std::__cxx11::string::~string(local_b88);
    std::allocator<char>::~allocator((allocator<char> *)&local_b89);
    paVar6 = &local_c61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c60,"property_name",paVar6);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_30,__k);
    std::operator+((char *)paVar6,local_30);
    std::operator+(in_stack_ffffffffffffef18,(char *)in_stack_ffffffffffffef10);
    paVar6 = &local_c89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c88,"default_value",paVar6);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_30,__k);
    std::operator+(in_stack_ffffffffffffef18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffef10);
    paVar6 = &local_cb1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cb0,"other_has_property_check",paVar6);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_30,__k);
    std::__cxx11::string::operator=((string *)pmVar4,local_c00);
    std::__cxx11::string::~string(local_cb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
    std::__cxx11::string::~string(local_c00);
    std::__cxx11::string::~string(local_c88);
    std::allocator<char>::~allocator((allocator<char> *)&local_c89);
    std::__cxx11::string::~string(local_c20);
    std::__cxx11::string::~string(local_c40);
    std::__cxx11::string::~string(local_c60);
    std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  }
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    std::map<string, string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8 tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  string tag_bytes = StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    tag_bytes += ", " + StrCat(tag_array[i]);
  }

  (*variables)["tag"] = StrCat(tag);
  (*variables)["tag_size"] = StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
        tag_bytes += ", " + StrCat(tag_array[i]);
    }

    variables_["end_tag"] = StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !IsProto2(descriptor_->file())) {
    (*variables)["name_def_message"] =
      (*variables)["name"] + "_ = " + (*variables)["default_value"];
  } else {
    (*variables)["name_def_message"] = (*variables)["name"] + "_";
  }
  if (IsProto2(descriptor_->file())) {
    (*variables)["has_property_check"] = "Has" + (*variables)["property_name"];
    (*variables)["other_has_property_check"] = "other.Has" + (*variables)["property_name"];
    (*variables)["has_not_property_check"] = "!" + (*variables)["has_property_check"];
    (*variables)["other_has_not_property_check"] = "!" + (*variables)["other_has_property_check"];
    if (presenceIndex_ != -1) {
      string hasBitsNumber = StrCat(presenceIndex_ / 32);
      string hasBitsMask = StrCat(1 << (presenceIndex_ % 32));
      (*variables)["has_field_check"] = "(_hasBits" + hasBitsNumber + " & " + hasBitsMask + ") != 0";
      (*variables)["set_has_field"] = "_hasBits" + hasBitsNumber + " |= " + hasBitsMask;
      (*variables)["clear_has_field"] = "_hasBits" + hasBitsNumber + " &= ~" + hasBitsMask;
    }
  } else {
    (*variables)["has_property_check"] =
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
    (*variables)["other_has_property_check"] = "other." +
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
  }
}